

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O0

Vec_Int_t * Pla_GenPrimes(int nVars)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p;
  Vec_Bit_t *p_00;
  Vec_Bit_t *vMap;
  Vec_Int_t *vPrimes;
  int local_10;
  int nBits;
  int n;
  int nVars_local;
  
  p = Vec_IntAlloc(1000);
  p_00 = Pla_ManPrimesTable(nVars);
  for (local_10 = 2; local_10 < 1 << ((byte)nVars & 0x1f); local_10 = local_10 + 1) {
    iVar1 = Vec_BitEntry(p_00,local_10);
    if (iVar1 != 0) {
      Vec_IntPush(p,local_10);
    }
  }
  uVar2 = Vec_IntSize(p);
  printf("Primes up to 2^%d = %d\n",(ulong)(uint)nVars,(ulong)uVar2);
  Vec_BitFree(p_00);
  return p;
}

Assistant:

Vec_Int_t * Pla_GenPrimes( int nVars )
{
    int n, nBits = ( 1 << nVars );
    Vec_Int_t * vPrimes = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vMap = Pla_ManPrimesTable( nVars );
    for ( n = 2; n < nBits; n++ )
        if ( Vec_BitEntry(vMap, n) )
            Vec_IntPush( vPrimes, n );
    printf( "Primes up to 2^%d = %d\n", nVars, Vec_IntSize(vPrimes) );
//    Abc_GenCountHits1( vMap, vPrimes, nVars );
    Vec_BitFree( vMap );
    return vPrimes;
}